

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.h
# Opt level: O1

void QDir::current(void)

{
  QDir *in_RDI;
  long in_FS_OFFSET;
  QArrayData *local_30 [3];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QDir::currentPath();
  QDir::QDir(in_RDI,(QString *)local_30);
  if (local_30[0] != (QArrayData *)0x0) {
    LOCK();
    (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30[0],2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline QDir current() { return QDir(currentPath()); }